

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOChrono.cpp
# Opt level: O3

vector<char,_std::allocator<char>_> * __thiscall
adios2::profiling::JSONProfiler::AggregateProfilingJSON
          (vector<char,_std::allocator<char>_> *__return_storage_ptr__,JSONProfiler *this,
          string *rankLog)

{
  pointer pcVar1;
  pointer puVar2;
  long lVar3;
  value_type *__val;
  size_t sVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> rankLogsSizes;
  string footer;
  string header;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88;
  undefined1 *local_70;
  size_t local_68;
  undefined1 local_60 [16];
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  helper::Comm::GatherValues<unsigned_long>(&local_88,this->m_Comm,rankLog->_M_string_length,0);
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar1 = (pointer)operator_new(3);
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_start = pcVar1;
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = pcVar1 + 3;
  *pcVar1 = '\0';
  pcVar1[1] = '\0';
  pcVar1[2] = '\0';
  (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
  super__Vector_impl_data._M_finish = pcVar1 + 3;
  local_50 = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"[\n","");
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"\n]\n","");
  if (this->m_RankMPI == 0) {
    if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      lVar3 = -2;
    }
    else {
      lVar3 = 0;
      puVar2 = local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        lVar3 = lVar3 + *puVar2;
        puVar2 = puVar2 + 1;
      } while (puVar2 != local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_finish);
      lVar3 = lVar3 + -2;
    }
    std::vector<char,_std::allocator<char>_>::resize
              (__return_storage_ptr__,local_48 + lVar3 + local_68);
    if (local_48 != 0) {
      memmove((__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
              super__Vector_impl_data._M_start,local_50,local_48);
    }
    pcVar1 = (__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar4 = local_48;
  }
  else {
    lVar3 = -2;
    sVar4 = 0;
  }
  helper::Comm::GathervArrays<char>
            (this->m_Comm,(rankLog->_M_dataplus)._M_p,rankLog->_M_string_length,
             local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start,
             (long)local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3,pcVar1 + sVar4,0);
  if ((this->m_RankMPI == 0) && (local_68 != 0)) {
    memmove((__return_storage_ptr__->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
            super__Vector_impl_data._M_start + lVar3 + sVar4,local_70,local_68);
  }
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if (local_50 != local_40) {
    operator_delete(local_50);
  }
  if (local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (size_t *)0x0) {
    operator_delete(local_88.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<char> JSONProfiler::AggregateProfilingJSON(const std::string &rankLog) const
{
    // Gather sizes
    const size_t rankLogSize = rankLog.size();
    std::vector<size_t> rankLogsSizes = m_Comm.GatherValues(rankLogSize);

    // Gatherv JSON per rank
    std::vector<char> profilingJSON(3);
    const std::string header("[\n");
    const std::string footer("\n]\n");
    size_t gatheredSize = 0;
    size_t position = 0;

    if (m_RankMPI == 0) // pre-allocate in destination
    {
        gatheredSize = std::accumulate(rankLogsSizes.begin(), rankLogsSizes.end(), size_t(0));

        profilingJSON.resize(gatheredSize + header.size() + footer.size() - 2);
        adios2::helper::CopyToBuffer(profilingJSON, position, header.c_str(), header.size());
    }

    m_Comm.GathervArrays(rankLog.c_str(), rankLog.size(), rankLogsSizes.data(),
                         rankLogsSizes.size(), &profilingJSON[position]);

    if (m_RankMPI == 0) // add footer to close JSON
    {
        position += gatheredSize - 2;
        helper::CopyToBuffer(profilingJSON, position, footer.c_str(), footer.size());
    }

    return profilingJSON;
}